

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_decorations.cpp
# Opt level: O0

spv_result_t
spvtools::val::anon_unknown_0::checkLayout
          (uint32_t struct_id,char *storage_class_str,char *decoration_str,bool blockRules,
          bool scalar_block_layout,uint32_t incoming_offset,MemberConstraints *constraints,
          ValidationState_t *vstate)

{
  value_type *pvVar1;
  bool bVar2;
  Op OVar3;
  uint32_t uVar4;
  Decoration DVar5;
  spv_const_validator_options psVar6;
  size_type sVar7;
  pointer pDVar8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar9;
  const_reference pvVar10;
  value_type *pvVar11;
  reference pvVar12;
  DiagnosticStream *pDVar13;
  set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>
  *this;
  uint *puVar14;
  uint32_t local_14e4;
  uint32_t local_14c4;
  DiagnosticStream local_14b0;
  uint32_t local_12d4;
  undefined1 local_12d0 [4];
  uint32_t element_size;
  uint32_t local_10f4;
  undefined1 auStack_10f0 [4];
  uint32_t stride_1;
  reference local_10e0;
  uint local_10cc;
  uint local_10c8;
  uint32_t next_offset;
  uint32_t i;
  vector<bool,_std::allocator<bool>_> seen;
  tuple<bool_&,_bool_&,_unsigned_int_&> local_1090;
  tuple<bool,_bool,_unsigned_int> local_1078;
  uint local_1070;
  bool local_106a;
  bool local_1069;
  uint32_t num_elements;
  bool is_const;
  bool is_int32;
  DiagnosticStream local_e90;
  Decoration *local_cb8;
  Decoration *decoration_1;
  iterator __end4;
  iterator __begin4;
  set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>
  *__range4;
  Instruction *pIStack_c90;
  uint32_t array_stride;
  Instruction *element_inst;
  uint32_t typeId;
  uint32_t array_alignment;
  Instruction *array_inst;
  uint32_t local_aa0;
  spv_result_t local_a9c;
  uint32_t stride;
  spv_result_t recursive_status;
  uint local_8bc;
  DiagnosticStream local_8b8;
  DiagnosticStream local_6e0;
  DiagnosticStream local_508;
  uint32_t local_32c;
  uint32_t local_328;
  uint32_t scalar_alignment;
  value_type componentId;
  uint32_t local_148;
  Op local_144;
  uint32_t size;
  Op opcode;
  Instruction *inst;
  uint32_t alignment;
  mapped_type *local_128;
  LayoutConstraints *constraint;
  uint32_t local_118;
  value_type id;
  uint32_t offset_1;
  uint32_t memberIdx_1;
  value_type *member_offset;
  size_t ordered_member_idx;
  uint32_t nextValidOffset;
  MemberOffsetPair *local_f0;
  MemberOffsetPair *local_e8;
  value_type local_e0;
  _Self local_d8;
  const_iterator decoration;
  FieldDecorationsIter member_decorations;
  uint32_t offset;
  uint32_t numMembers;
  uint32_t memberIdx;
  vector<MemberOffsetPair,_std::allocator<MemberOffsetPair>_> member_offsets;
  undefined1 local_80 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> members;
  Instruction **struct_type;
  anon_class_40_7_b84d8406 fail;
  bool relaxed_block_layout;
  uint32_t incoming_offset_local;
  bool scalar_block_layout_local;
  bool blockRules_local;
  char *decoration_str_local;
  char *storage_class_str_local;
  uint32_t struct_id_local;
  
  storage_class_str_local._0_4_ = struct_id;
  psVar6 = ValidationState_t::options(vstate);
  if ((psVar6->skip_block_layout & 1U) == 0) {
    psVar6 = ValidationState_t::options(vstate);
    relaxed_block_layout = blockRules;
    if ((psVar6->uniform_buffer_standard_layout & 1U) != 0) {
      relaxed_block_layout = false;
    }
    fail.decoration_str._1_1_ = ValidationState_t::IsRelaxedBlockLayout(vstate);
    struct_type = (Instruction **)vstate;
    fail.vstate._0_4_ = (uint32_t)storage_class_str_local;
    fail.decoration_str._0_1_ = relaxed_block_layout & 1;
    fail._8_8_ = storage_class_str;
    fail.storage_class_str = decoration_str;
    fail.decoration_str._2_1_ = scalar_block_layout;
    fail._39_1_ = fail.decoration_str._1_1_;
    members.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)ValidationState_t::FindDef(vstate,(uint32_t)storage_class_str_local);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_80);
    OVar3 = Instruction::opcode((Instruction *)
                                members.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage);
    if (OVar3 == OpTypeStruct) {
      getStructMembers((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                       &member_offsets.
                        super__Vector_base<MemberOffsetPair,_std::allocator<MemberOffsetPair>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage,
                       (uint32_t)storage_class_str_local,vstate);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_80,
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 &member_offsets.
                  super__Vector_base<MemberOffsetPair,_std::allocator<MemberOffsetPair>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 &member_offsets.
                  super__Vector_base<MemberOffsetPair,_std::allocator<MemberOffsetPair>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
    }
    else {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_80,
                 (value_type_conflict2 *)&storage_class_str_local);
    }
    std::vector<MemberOffsetPair,_std::allocator<MemberOffsetPair>_>::vector
              ((vector<MemberOffsetPair,_std::allocator<MemberOffsetPair>_> *)&numMembers);
    OVar3 = Instruction::opcode((Instruction *)
                                members.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage);
    if (OVar3 == OpTypeStruct) {
      sVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_80);
      std::vector<MemberOffsetPair,_std::allocator<MemberOffsetPair>_>::reserve
                ((vector<MemberOffsetPair,_std::allocator<MemberOffsetPair>_> *)&numMembers,sVar7);
      offset = 0;
      sVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_80);
      for (; offset < (uint)sVar7; offset = offset + 1) {
        member_decorations.end._M_node._4_4_ = 0xffffffff;
        _decoration = ValidationState_t::id_member_decorations
                                (vstate,(uint32_t)storage_class_str_local,offset);
        local_d8._M_node = decoration._M_node;
        while (bVar2 = std::operator!=(&local_d8,&member_decorations.begin), bVar2) {
          pDVar8 = std::_Rb_tree_const_iterator<spvtools::val::Decoration>::operator->(&local_d8);
          uVar4 = Decoration::struct_member_index(pDVar8);
          if (uVar4 != offset) {
            __assert_fail("decoration->struct_member_index() == (int)memberIdx",
                          "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_decorations.cpp"
                          ,0x1d4,
                          "spv_result_t spvtools::val::(anonymous namespace)::checkLayout(uint32_t, const char *, const char *, bool, bool, uint32_t, MemberConstraints &, ValidationState_t &)"
                         );
          }
          pDVar8 = std::_Rb_tree_const_iterator<spvtools::val::Decoration>::operator->(&local_d8);
          DVar5 = Decoration::dec_type(pDVar8);
          if (DVar5 == Offset) {
            pDVar8 = std::_Rb_tree_const_iterator<spvtools::val::Decoration>::operator->(&local_d8);
            pvVar9 = Decoration::params(pDVar8);
            pvVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](pvVar9,0)
            ;
            member_decorations.end._M_node._4_4_ = *pvVar10;
          }
          std::_Rb_tree_const_iterator<spvtools::val::Decoration>::operator++(&local_d8);
        }
        local_e0.member = offset;
        local_e0.offset = incoming_offset + member_decorations.end._M_node._4_4_;
        std::vector<MemberOffsetPair,_std::allocator<MemberOffsetPair>_>::push_back
                  ((vector<MemberOffsetPair,_std::allocator<MemberOffsetPair>_> *)&numMembers,
                   &local_e0);
      }
      local_e8 = (MemberOffsetPair *)
                 std::vector<MemberOffsetPair,_std::allocator<MemberOffsetPair>_>::begin
                           ((vector<MemberOffsetPair,_std::allocator<MemberOffsetPair>_> *)
                            &numMembers);
      local_f0 = (MemberOffsetPair *)
                 std::vector<MemberOffsetPair,_std::allocator<MemberOffsetPair>_>::end
                           ((vector<MemberOffsetPair,_std::allocator<MemberOffsetPair>_> *)
                            &numMembers);
      std::
      stable_sort<__gnu_cxx::__normal_iterator<spvtools::val::(anonymous_namespace)::checkLayout(unsigned_int,char_const*,char_const*,bool,bool,unsigned_int,std::unordered_map<std::pair<unsigned_int,unsigned_int>,spvtools::val::(anonymous_namespace)::LayoutConstraints,spvtools::val::(anonymous_namespace)::PairHash,std::equal_to<std::pair<unsigned_int,unsigned_int>>,std::allocator<std::pair<std::pair<unsigned_int,unsigned_int>const,spvtools::val::(anonymous_namespace)::LayoutConstraints>>>&,spvtools::val::ValidationState_t&)::MemberOffsetPair*,std::vector<spvtools::val::(anonymous_namespace)::checkLayout(unsigned_int,char_const*,char_const*,bool,bool,unsigned_int,std::unordered_map<std::pair<unsigned_int,unsigned_int>,spvtools::val::(anonymous_namespace)::LayoutConstraints,spvtools::val::(anonymous_namespace)::PairHash,std::equal_to<std::pair<unsigned_int,unsigned_int>>,std::allocator<std::pair<std::pair<unsigned_int,unsigned_int>const,spvtools::val::(anonymous_namespace)::LayoutConstraints>>___spvtools::val::(anonymous_namespace)::LayoutConstraints>>>&,spvtools::val::ValidationState_t&)::__0>
                (local_e8,local_f0);
    }
    else {
      ordered_member_idx._4_4_ = 0;
      nextValidOffset = 0;
      std::vector<MemberOffsetPair,_std::allocator<MemberOffsetPair>_>::push_back
                ((vector<MemberOffsetPair,_std::allocator<MemberOffsetPair>_> *)&numMembers,
                 (value_type *)((long)&ordered_member_idx + 4));
    }
    ordered_member_idx._0_4_ = 0;
    for (member_offset = (value_type *)0x0; pvVar1 = member_offset,
        pvVar11 = (value_type *)
                  std::vector<MemberOffsetPair,_std::allocator<MemberOffsetPair>_>::size
                            ((vector<MemberOffsetPair,_std::allocator<MemberOffsetPair>_> *)
                             &numMembers), pvVar1 < pvVar11;
        member_offset = (value_type *)((long)&member_offset->member + 1)) {
      _offset_1 = std::vector<MemberOffsetPair,_std::allocator<MemberOffsetPair>_>::operator[]
                            ((vector<MemberOffsetPair,_std::allocator<MemberOffsetPair>_> *)
                             &numMembers,(size_type)member_offset);
      id = _offset_1->member;
      local_118 = _offset_1->offset;
      pvVar12 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_80,
                           (ulong)_offset_1->member);
      constraint._4_4_ = *pvVar12;
      inst._4_4_ = id;
      _alignment = std::make_pair<unsigned_int&,unsigned_int>
                             ((uint *)&storage_class_str_local,(uint *)((long)&inst + 4));
      local_128 = std::
                  unordered_map<std::pair<unsigned_int,_unsigned_int>,_spvtools::val::(anonymous_namespace)::LayoutConstraints,_spvtools::val::(anonymous_namespace)::PairHash,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_spvtools::val::(anonymous_namespace)::LayoutConstraints>_>_>
                  ::operator[](constraints,(key_type *)&alignment);
      if (scalar_block_layout) {
        local_14c4 = getScalarAlignment(constraint._4_4_,vstate);
      }
      else {
        local_14c4 = getBaseAlignment(constraint._4_4_,(bool)(relaxed_block_layout & 1),local_128,
                                      constraints,vstate);
      }
      inst._0_4_ = local_14c4;
      _size = ValidationState_t::FindDef(vstate,constraint._4_4_);
      local_144 = Instruction::opcode(_size);
      local_148 = getSize(constraint._4_4_,local_128,constraints,vstate);
      if (local_118 == 0xffffffff) {
        checkLayout::anon_class_40_7_b84d8406::operator()
                  ((DiagnosticStream *)&componentId,(anon_class_40_7_b84d8406 *)&struct_type,id);
        pDVar13 = DiagnosticStream::operator<<
                            ((DiagnosticStream *)&componentId,
                             (char (*) [32])"is missing an Offset decoration");
        storage_class_str_local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar13);
        DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&componentId);
        scalar_alignment = 1;
        goto LAB_0053bb31;
      }
      if (((scalar_block_layout) || ((fail._39_1_ & 1) == 0)) || (local_144 != OpTypeVector)) {
        bVar2 = IsAlignedTo(local_118,(uint32_t)inst);
        if (!bVar2) {
          checkLayout::anon_class_40_7_b84d8406::operator()
                    (&local_6e0,(anon_class_40_7_b84d8406 *)&struct_type,id);
          pDVar13 = DiagnosticStream::operator<<(&local_6e0,(char (*) [11])0x626719);
          pDVar13 = DiagnosticStream::operator<<(pDVar13,&local_118);
          pDVar13 = DiagnosticStream::operator<<(pDVar13,(char (*) [20])" is not aligned to ");
          pDVar13 = DiagnosticStream::operator<<(pDVar13,(uint *)&inst);
          storage_class_str_local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar13);
          DiagnosticStream::~DiagnosticStream(&local_6e0);
          scalar_alignment = 1;
          goto LAB_0053bb31;
        }
      }
      else {
        pvVar9 = Instruction::words(_size);
        pvVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](pvVar9,2);
        local_328 = *pvVar10;
        local_32c = getScalarAlignment(local_328,vstate);
        bVar2 = IsAlignedTo(local_118,local_32c);
        if (!bVar2) {
          checkLayout::anon_class_40_7_b84d8406::operator()
                    (&local_508,(anon_class_40_7_b84d8406 *)&struct_type,id);
          pDVar13 = DiagnosticStream::operator<<(&local_508,(char (*) [11])0x626719);
          pDVar13 = DiagnosticStream::operator<<(pDVar13,&local_118);
          pDVar13 = DiagnosticStream::operator<<
                              (pDVar13,(char (*) [40])" is not aligned to scalar element size ");
          pDVar13 = DiagnosticStream::operator<<(pDVar13,&local_32c);
          storage_class_str_local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar13);
          DiagnosticStream::~DiagnosticStream(&local_508);
          scalar_alignment = 1;
          goto LAB_0053bb31;
        }
      }
      if (local_118 < (uint32_t)ordered_member_idx) {
        checkLayout::anon_class_40_7_b84d8406::operator()
                  (&local_8b8,(anon_class_40_7_b84d8406 *)&struct_type,id);
        pDVar13 = DiagnosticStream::operator<<(&local_8b8,(char (*) [11])0x626719);
        pDVar13 = DiagnosticStream::operator<<(pDVar13,&local_118);
        pDVar13 = DiagnosticStream::operator<<
                            (pDVar13,(char (*) [44])" overlaps previous member ending at offset ");
        local_8bc = (uint32_t)ordered_member_idx - 1;
        pDVar13 = DiagnosticStream::operator<<(pDVar13,&local_8bc);
        storage_class_str_local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar13);
        DiagnosticStream::~DiagnosticStream(&local_8b8);
        scalar_alignment = 1;
        goto LAB_0053bb31;
      }
      if (((!scalar_block_layout) && ((fail._39_1_ & 1) != 0)) &&
         ((local_144 == OpTypeVector &&
          (bVar2 = hasImproperStraddle(constraint._4_4_,local_118,local_128,constraints,vstate),
          bVar2)))) {
        checkLayout::anon_class_40_7_b84d8406::operator()
                  ((DiagnosticStream *)&stride,(anon_class_40_7_b84d8406 *)&struct_type,id);
        pDVar13 = DiagnosticStream::operator<<
                            ((DiagnosticStream *)&stride,
                             (char (*) [46])"is an improperly straddling vector at offset ");
        pDVar13 = DiagnosticStream::operator<<(pDVar13,&local_118);
        storage_class_str_local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar13);
        DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&stride);
        scalar_alignment = 1;
        goto LAB_0053bb31;
      }
      local_a9c = SPV_SUCCESS;
      if ((local_144 == OpTypeStruct) &&
         (local_a9c = checkLayout(constraint._4_4_,storage_class_str,decoration_str,
                                  (bool)(relaxed_block_layout & 1),scalar_block_layout,local_118,
                                  constraints,vstate), local_a9c != SPV_SUCCESS)) {
        scalar_alignment = 1;
        storage_class_str_local._4_4_ = local_a9c;
        goto LAB_0053bb31;
      }
      if (local_144 == OpTypeMatrix) {
        local_aa0 = local_128->matrix_stride;
        bVar2 = IsAlignedTo(local_aa0,(uint32_t)inst);
        if (!bVar2) {
          checkLayout::anon_class_40_7_b84d8406::operator()
                    ((DiagnosticStream *)&array_inst,(anon_class_40_7_b84d8406 *)&struct_type,id);
          pDVar13 = DiagnosticStream::operator<<
                              ((DiagnosticStream *)&array_inst,
                               (char (*) [25])"is a matrix with stride ");
          pDVar13 = DiagnosticStream::operator<<(pDVar13,&local_aa0);
          pDVar13 = DiagnosticStream::operator<<
                              (pDVar13,(char (*) [30])" not satisfying alignment to ");
          pDVar13 = DiagnosticStream::operator<<(pDVar13,(uint *)&inst);
          storage_class_str_local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar13);
          DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&array_inst);
          scalar_alignment = 1;
          goto LAB_0053bb31;
        }
      }
      _typeId = _size;
      element_inst._4_4_ = (uint32_t)inst;
      while( true ) {
        OVar3 = Instruction::opcode(_typeId);
        bVar2 = true;
        if (OVar3 != OpTypeArray) {
          OVar3 = Instruction::opcode(_typeId);
          bVar2 = OVar3 == OpTypeRuntimeArray;
        }
        if (!bVar2) break;
        element_inst._0_4_ = Instruction::word(_typeId,2);
        pIStack_c90 = ValidationState_t::FindDef(vstate,(uint32_t)element_inst);
        __range4._4_4_ = 0;
        uVar4 = Instruction::id(_typeId);
        this = ValidationState_t::id_decorations(vstate,uVar4);
        __end4 = std::
                 set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>
                 ::begin(this);
        decoration_1 = (Decoration *)
                       std::
                       set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>
                       ::end(this);
        while (bVar2 = std::operator!=(&__end4,(_Self *)&decoration_1), bVar2) {
          local_cb8 = std::_Rb_tree_const_iterator<spvtools::val::Decoration>::operator*(&__end4);
          DVar5 = Decoration::dec_type(local_cb8);
          if (DVar5 == ArrayStride) {
            pvVar9 = Decoration::params(local_cb8);
            pvVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](pvVar9,0)
            ;
            __range4._4_4_ = *pvVar10;
            if (__range4._4_4_ == 0) {
              checkLayout::anon_class_40_7_b84d8406::operator()
                        (&local_e90,(anon_class_40_7_b84d8406 *)&struct_type,id);
              pDVar13 = DiagnosticStream::operator<<
                                  (&local_e90,(char (*) [32])"contains an array with stride 0");
              storage_class_str_local._4_4_ =
                   DiagnosticStream::operator_cast_to_spv_result_t(pDVar13);
              DiagnosticStream::~DiagnosticStream(&local_e90);
              scalar_alignment = 1;
              goto LAB_0053bb31;
            }
            bVar2 = IsAlignedTo(__range4._4_4_,element_inst._4_4_);
            if (!bVar2) {
              checkLayout::anon_class_40_7_b84d8406::operator()
                        ((DiagnosticStream *)&num_elements,(anon_class_40_7_b84d8406 *)&struct_type,
                         id);
              pDVar13 = DiagnosticStream::operator<<
                                  ((DiagnosticStream *)&num_elements,
                                   (char (*) [31])"contains an array with stride ");
              pvVar9 = Decoration::params(local_cb8);
              pvVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                  (pvVar9,0);
              pDVar13 = DiagnosticStream::operator<<(pDVar13,pvVar10);
              pDVar13 = DiagnosticStream::operator<<
                                  (pDVar13,(char (*) [30])" not satisfying alignment to ");
              pDVar13 = DiagnosticStream::operator<<(pDVar13,(uint *)&inst);
              storage_class_str_local._4_4_ =
                   DiagnosticStream::operator_cast_to_spv_result_t(pDVar13);
              DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&num_elements);
              scalar_alignment = 1;
              goto LAB_0053bb31;
            }
          }
          std::_Rb_tree_const_iterator<spvtools::val::Decoration>::operator++(&__end4);
        }
        local_1069 = false;
        local_106a = false;
        local_1070 = 0;
        OVar3 = Instruction::opcode(_typeId);
        if (OVar3 == OpTypeArray) {
          uVar4 = Instruction::word(_typeId,3);
          ValidationState_t::EvalInt32IfConst(&local_1078,vstate,uVar4);
          std::tie<bool,bool,unsigned_int>(&local_1090,&local_1069,&local_106a,&local_1070);
          std::tuple<bool&,bool&,unsigned_int&>::operator=
                    ((tuple<bool&,bool&,unsigned_int&> *)&local_1090,&local_1078);
        }
        seen.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_end_of_storage._4_4_ = 1;
        puVar14 = std::max<unsigned_int>
                            ((uint *)((long)&seen.super__Bvector_base<std::allocator<bool>_>._M_impl
                                             .super__Bvector_impl_data._M_end_of_storage + 4),
                             &local_1070);
        local_1070 = *puVar14;
        OVar3 = Instruction::opcode(pIStack_c90);
        if (OVar3 == OpTypeStruct) {
          next_offset._3_1_ = 0;
          std::allocator<bool>::allocator((allocator<bool> *)((long)&next_offset + 2));
          std::vector<bool,_std::allocator<bool>_>::vector
                    ((vector<bool,_std::allocator<bool>_> *)&i,0x10,(bool *)((long)&next_offset + 3)
                     ,(allocator_type *)((long)&next_offset + 2));
          std::allocator<bool>::~allocator((allocator<bool> *)((long)&next_offset + 2));
          for (local_10c8 = 0; local_10c8 < local_1070; local_10c8 = local_10c8 + 1) {
            local_10cc = local_10c8 * __range4._4_4_ + local_118;
            local_10e0 = std::vector<bool,_std::allocator<bool>_>::operator[]
                                   ((vector<bool,_std::allocator<bool>_> *)&i,
                                    (ulong)(local_10cc & 0xf));
            bVar2 = std::_Bit_reference::operator_cast_to_bool(&local_10e0);
            if (bVar2) break;
            local_a9c = checkLayout((uint32_t)element_inst,storage_class_str,decoration_str,
                                    (bool)(relaxed_block_layout & 1),scalar_block_layout,local_10cc,
                                    constraints,vstate);
            if (local_a9c != SPV_SUCCESS) {
              scalar_alignment = 1;
              storage_class_str_local._4_4_ = local_a9c;
              goto LAB_0053b8ba;
            }
            _auStack_10f0 =
                 std::vector<bool,_std::allocator<bool>_>::operator[]
                           ((vector<bool,_std::allocator<bool>_> *)&i,(ulong)(local_10cc & 0xf));
            std::_Bit_reference::operator=((_Bit_reference *)auStack_10f0,true);
          }
          scalar_alignment = 0;
LAB_0053b8ba:
          std::vector<bool,_std::allocator<bool>_>::~vector
                    ((vector<bool,_std::allocator<bool>_> *)&i);
          if (scalar_alignment != 0) goto LAB_0053bb31;
        }
        else {
          OVar3 = Instruction::opcode(pIStack_c90);
          if (OVar3 == OpTypeMatrix) {
            local_10f4 = local_128->matrix_stride;
            bVar2 = IsAlignedTo(local_10f4,(uint32_t)inst);
            if (!bVar2) {
              checkLayout::anon_class_40_7_b84d8406::operator()
                        ((DiagnosticStream *)local_12d0,(anon_class_40_7_b84d8406 *)&struct_type,id)
              ;
              pDVar13 = DiagnosticStream::operator<<
                                  ((DiagnosticStream *)local_12d0,
                                   (char (*) [25])"is a matrix with stride ");
              pDVar13 = DiagnosticStream::operator<<(pDVar13,&local_10f4);
              pDVar13 = DiagnosticStream::operator<<
                                  (pDVar13,(char (*) [30])" not satisfying alignment to ");
              pDVar13 = DiagnosticStream::operator<<(pDVar13,(uint *)&inst);
              storage_class_str_local._4_4_ =
                   DiagnosticStream::operator_cast_to_spv_result_t(pDVar13);
              DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_12d0);
              scalar_alignment = 1;
              goto LAB_0053bb31;
            }
          }
        }
        _typeId = pIStack_c90;
        if (scalar_block_layout) {
          uVar4 = Instruction::id(pIStack_c90);
          local_14e4 = getScalarAlignment(uVar4,vstate);
        }
        else {
          uVar4 = Instruction::id(pIStack_c90);
          local_14e4 = getBaseAlignment(uVar4,(bool)(relaxed_block_layout & 1),local_128,constraints
                                        ,vstate);
        }
        element_inst._4_4_ = local_14e4;
        uVar4 = Instruction::id(pIStack_c90);
        local_12d4 = getSize(uVar4,local_128,constraints,vstate);
        if (__range4._4_4_ < local_12d4) {
          checkLayout::anon_class_40_7_b84d8406::operator()
                    (&local_14b0,(anon_class_40_7_b84d8406 *)&struct_type,id);
          pDVar13 = DiagnosticStream::operator<<
                              (&local_14b0,(char (*) [31])"contains an array with stride ");
          pDVar13 = DiagnosticStream::operator<<(pDVar13,(uint *)((long)&__range4 + 4));
          pDVar13 = DiagnosticStream::operator<<
                              (pDVar13,(char (*) [31])", but with an element size of ");
          pDVar13 = DiagnosticStream::operator<<(pDVar13,&local_12d4);
          storage_class_str_local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar13);
          DiagnosticStream::~DiagnosticStream(&local_14b0);
          scalar_alignment = 1;
          goto LAB_0053bb31;
        }
      }
      ordered_member_idx._0_4_ = local_118 + local_148;
      if ((!scalar_block_layout) && ((local_144 == OpTypeArray || (local_144 == OpTypeStruct)))) {
        ordered_member_idx._0_4_ = align((uint32_t)ordered_member_idx,(uint32_t)inst);
      }
    }
    storage_class_str_local._4_4_ = SPV_SUCCESS;
    scalar_alignment = 1;
LAB_0053bb31:
    std::vector<MemberOffsetPair,_std::allocator<MemberOffsetPair>_>::~vector
              ((vector<MemberOffsetPair,_std::allocator<MemberOffsetPair>_> *)&numMembers);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_80);
  }
  else {
    storage_class_str_local._4_4_ = SPV_SUCCESS;
  }
  return storage_class_str_local._4_4_;
}

Assistant:

spv_result_t checkLayout(uint32_t struct_id, const char* storage_class_str,
                         const char* decoration_str, bool blockRules,
                         bool scalar_block_layout,
                         uint32_t incoming_offset,
                         MemberConstraints& constraints,
                         ValidationState_t& vstate) {
  if (vstate.options()->skip_block_layout) return SPV_SUCCESS;

  // blockRules are the same as bufferBlock rules if the uniform buffer
  // standard layout extension is being used.
  if (vstate.options()->uniform_buffer_standard_layout) blockRules = false;

  // Relaxed layout and scalar layout can both be in effect at the same time.
  // For example, relaxed layout is implied by Vulkan 1.1.  But scalar layout
  // is more permissive than relaxed layout.
  const bool relaxed_block_layout = vstate.IsRelaxedBlockLayout();

  auto fail = [&vstate, struct_id, storage_class_str, decoration_str,
               blockRules, relaxed_block_layout,
               scalar_block_layout](uint32_t member_idx) -> DiagnosticStream {
    DiagnosticStream ds =
        std::move(vstate.diag(SPV_ERROR_INVALID_ID, vstate.FindDef(struct_id))
                  << "Structure id " << struct_id << " decorated as "
                  << decoration_str << " for variable in " << storage_class_str
                  << " storage class must follow "
                  << (scalar_block_layout
                          ? "scalar "
                          : (relaxed_block_layout ? "relaxed " : "standard "))
                  << (blockRules ? "uniform buffer" : "storage buffer")
                  << " layout rules: member " << member_idx << " ");
    return ds;
  };

  // If we are checking the layout of untyped pointers or physical storage
  // buffer pointers, we may not actually have a struct here. Instead, pretend
  // we have a struct with a single member at offset 0.
  const auto& struct_type = vstate.FindDef(struct_id);
  std::vector<uint32_t> members;
  if (struct_type->opcode() == spv::Op::OpTypeStruct) {
    members = getStructMembers(struct_id, vstate);
  } else {
    members.push_back(struct_id);
  }

  // To check for member overlaps, we want to traverse the members in
  // offset order.
  struct MemberOffsetPair {
    uint32_t member;
    uint32_t offset;
  };
  std::vector<MemberOffsetPair> member_offsets;

  // With untyped pointers or physical storage buffers, we might be checking
  // layouts that do not originate from a structure.
  if (struct_type->opcode() == spv::Op::OpTypeStruct) {
    member_offsets.reserve(members.size());
    for (uint32_t memberIdx = 0, numMembers = uint32_t(members.size());
         memberIdx < numMembers; memberIdx++) {
      uint32_t offset = 0xffffffff;
      auto member_decorations =
          vstate.id_member_decorations(struct_id, memberIdx);
      for (auto decoration = member_decorations.begin;
           decoration != member_decorations.end; ++decoration) {
        assert(decoration->struct_member_index() == (int)memberIdx);
        switch (decoration->dec_type()) {
          case spv::Decoration::Offset:
            offset = decoration->params()[0];
            break;
          default:
            break;
        }
      }
      member_offsets.push_back(
          MemberOffsetPair{memberIdx, incoming_offset + offset});
    }
    std::stable_sort(
        member_offsets.begin(), member_offsets.end(),
        [](const MemberOffsetPair& lhs, const MemberOffsetPair& rhs) {
          return lhs.offset < rhs.offset;
        });
  } else {
    member_offsets.push_back({0, 0});
  }

  // Now scan from lowest offset to highest offset.
  uint32_t nextValidOffset = 0;
  for (size_t ordered_member_idx = 0;
       ordered_member_idx < member_offsets.size(); ordered_member_idx++) {
    const auto& member_offset = member_offsets[ordered_member_idx];
    const auto memberIdx = member_offset.member;
    const auto offset = member_offset.offset;
    auto id = members[member_offset.member];
    const LayoutConstraints& constraint =
        constraints[std::make_pair(struct_id, uint32_t(memberIdx))];
    // Scalar layout takes precedence because it's more permissive, and implying
    // an alignment that divides evenly into the alignment that would otherwise
    // be used.
    const auto alignment =
        scalar_block_layout
            ? getScalarAlignment(id, vstate)
            : getBaseAlignment(id, blockRules, constraint, constraints, vstate);
    const auto inst = vstate.FindDef(id);
    const auto opcode = inst->opcode();
    const auto size = getSize(id, constraint, constraints, vstate);
    // Check offset.
    if (offset == 0xffffffff)
      return fail(memberIdx) << "is missing an Offset decoration";
    if (!scalar_block_layout && relaxed_block_layout &&
        opcode == spv::Op::OpTypeVector) {
      // In relaxed block layout, the vector offset must be aligned to the
      // vector's scalar element type.
      const auto componentId = inst->words()[2];
      const auto scalar_alignment = getScalarAlignment(componentId, vstate);
      if (!IsAlignedTo(offset, scalar_alignment)) {
        return fail(memberIdx)
               << "at offset " << offset
               << " is not aligned to scalar element size " << scalar_alignment;
      }
    } else {
      // Without relaxed block layout, the offset must be divisible by the
      // alignment requirement.
      if (!IsAlignedTo(offset, alignment)) {
        return fail(memberIdx)
               << "at offset " << offset << " is not aligned to " << alignment;
      }
    }
    if (offset < nextValidOffset)
      return fail(memberIdx) << "at offset " << offset
                             << " overlaps previous member ending at offset "
                             << nextValidOffset - 1;
    if (!scalar_block_layout && relaxed_block_layout) {
      // Check improper straddle of vectors.
      if (spv::Op::OpTypeVector == opcode &&
          hasImproperStraddle(id, offset, constraint, constraints, vstate))
        return fail(memberIdx)
               << "is an improperly straddling vector at offset " << offset;
    }
    // Check struct members recursively.
    spv_result_t recursive_status = SPV_SUCCESS;
    if (spv::Op::OpTypeStruct == opcode &&
        SPV_SUCCESS != (recursive_status = checkLayout(
                            id, storage_class_str, decoration_str, blockRules,
                            scalar_block_layout, offset, constraints, vstate)))
      return recursive_status;
    // Check matrix stride.
    if (spv::Op::OpTypeMatrix == opcode) {
      const auto stride = constraint.matrix_stride;
      if (!IsAlignedTo(stride, alignment)) {
        return fail(memberIdx) << "is a matrix with stride " << stride
                               << " not satisfying alignment to " << alignment;
      }
    }

    // Check arrays and runtime arrays recursively.
    auto array_inst = inst;
    auto array_alignment = alignment;
    while (array_inst->opcode() == spv::Op::OpTypeArray ||
           array_inst->opcode() == spv::Op::OpTypeRuntimeArray) {
      const auto typeId = array_inst->word(2);
      const auto element_inst = vstate.FindDef(typeId);
      // Check array stride.
      uint32_t array_stride = 0;
      for (auto& decoration : vstate.id_decorations(array_inst->id())) {
        if (spv::Decoration::ArrayStride == decoration.dec_type()) {
          array_stride = decoration.params()[0];
          if (array_stride == 0) {
            return fail(memberIdx) << "contains an array with stride 0";
          }
          if (!IsAlignedTo(array_stride, array_alignment))
            return fail(memberIdx)
                   << "contains an array with stride " << decoration.params()[0]
                   << " not satisfying alignment to " << alignment;
        }
      }

      bool is_int32 = false;
      bool is_const = false;
      uint32_t num_elements = 0;
      if (array_inst->opcode() == spv::Op::OpTypeArray) {
        std::tie(is_int32, is_const, num_elements) =
            vstate.EvalInt32IfConst(array_inst->word(3));
      }
      num_elements = std::max(1u, num_elements);
      // Check each element recursively if it is a struct. There is a
      // limitation to this check if the array size is a spec constant or is a
      // runtime array then we will only check a single element. This means
      // some improper straddles might be missed.
      if (spv::Op::OpTypeStruct == element_inst->opcode()) {
        std::vector<bool> seen(16, false);
        for (uint32_t i = 0; i < num_elements; ++i) {
          uint32_t next_offset = i * array_stride + offset;
          // Stop checking if offsets repeat in terms of 16-byte multiples.
          if (seen[next_offset % 16]) {
            break;
          }

          if (SPV_SUCCESS !=
              (recursive_status = checkLayout(
                   typeId, storage_class_str, decoration_str, blockRules,
                   scalar_block_layout, next_offset, constraints, vstate)))
            return recursive_status;

          seen[next_offset % 16] = true;
        }
      } else if (spv::Op::OpTypeMatrix == element_inst->opcode()) {
        // Matrix stride would be on the array element in the struct.
        const auto stride = constraint.matrix_stride;
        if (!IsAlignedTo(stride, alignment)) {
          return fail(memberIdx)
                 << "is a matrix with stride " << stride
                 << " not satisfying alignment to " << alignment;
        }
      }

      // Proceed to the element in case it is an array.
      array_inst = element_inst;
      array_alignment = scalar_block_layout
                            ? getScalarAlignment(array_inst->id(), vstate)
                            : getBaseAlignment(array_inst->id(), blockRules,
                                               constraint, constraints, vstate);

      const auto element_size =
          getSize(element_inst->id(), constraint, constraints, vstate);
      if (element_size > array_stride) {
        return fail(memberIdx)
               << "contains an array with stride " << array_stride
               << ", but with an element size of " << element_size;
      }
    }
    nextValidOffset = offset + size;
    if (!scalar_block_layout &&
        (spv::Op::OpTypeArray == opcode || spv::Op::OpTypeStruct == opcode)) {
      // Non-scalar block layout rules don't permit anything in the padding of
      // a struct or array.
      nextValidOffset = align(nextValidOffset, alignment);
    }
  }
  return SPV_SUCCESS;
}